

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_channel_id_parse_clienthello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((contents != (CBS *)0x0) && ((hs->config->field_0x10d & 8) != 0)) {
    iVar1 = SSL_is_dtls(hs->ssl);
    if (iVar1 == 0) {
      if (contents->len == 0) {
        hs->field_0x6cb = hs->field_0x6cb | 1;
      }
      else {
        bVar2 = false;
      }
    }
  }
  return bVar2;
}

Assistant:

static bool ext_channel_id_parse_clienthello(SSL_HANDSHAKE *hs,
                                             uint8_t *out_alert,
                                             CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL || !hs->config->channel_id_enabled || SSL_is_dtls(ssl)) {
    return true;
  }

  if (CBS_len(contents) != 0) {
    return false;
  }

  hs->channel_id_negotiated = true;
  return true;
}